

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::ComputeWeights
          (TPZDohrSubstruct<std::complex<long_double>_> *this,
          TPZFMatrix<std::complex<long_double>_> *StiffnessDiag)

{
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pair<int,_int> *ppVar6;
  complex<long_double> *pcVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 Var11;
  unkbyte10 Var12;
  
  uVar8 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar8) {
    uVar10 = 0;
    do {
      ppVar6 = (this->fGlobalEqs).fStore;
      iVar3 = ppVar6[uVar10].first;
      lVar9 = (long)ppVar6[uVar10].second;
      pcVar7 = (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore;
      if (((lVar9 < 0) ||
          ((StiffnessDiag->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <=
           lVar9)) ||
         ((StiffnessDiag->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)
         ) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      uVar1 = *(undefined2 *)(pcVar7[iVar3]._M_value + 0xe);
      uVar4 = *(undefined4 *)(pcVar7[iVar3]._M_value + 10);
      uVar5 = *(undefined4 *)(pcVar7[iVar3]._M_value + 0x1a);
      uVar2 = *(undefined2 *)(pcVar7[iVar3]._M_value + 0x1e);
      Var11 = in_ST3;
      Var12 = in_ST3;
      __divxc3();
      pcVar7 = (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore;
      *(unkbyte10 *)pcVar7[iVar3]._M_value = in_ST0;
      *(undefined2 *)(pcVar7[iVar3]._M_value + 0xe) = uVar1;
      *(undefined4 *)(pcVar7[iVar3]._M_value + 10) = uVar4;
      *(unkbyte10 *)(pcVar7[iVar3]._M_value + 0x10) = in_ST1;
      *(undefined4 *)(pcVar7[iVar3]._M_value + 0x1a) = uVar5;
      *(undefined2 *)(pcVar7[iVar3]._M_value + 0x1e) = uVar2;
      uVar10 = uVar10 + 1;
      in_ST0 = in_ST2;
      in_ST1 = in_ST3;
      in_ST2 = Var11;
      in_ST3 = Var12;
    } while ((uVar8 & 0x7fffffff) != uVar10);
  }
  if (0 < (this->fInternalEqs).fNElements) {
    lVar9 = 0;
    do {
      iVar3 = (this->fInternalEqs).fStore[lVar9];
      pcVar7 = (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore;
      *(longdouble *)pcVar7[iVar3]._M_value = (longdouble)1;
      *(longdouble *)(pcVar7[iVar3]._M_value + 0x10) = (longdouble)0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->fInternalEqs).fNElements);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeWeights(TPZFMatrix<TVar> &StiffnessDiag) {
	int i;
	//fWeights.Fill(1.);
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		fWeights[ind.first] = fWeights[ind.first] / StiffnessDiag(ind.second,0);
	}
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fWeights[fInternalEqs[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}